

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
protozero::CopyablePtr<perfetto::protos::gen::ChromeKeyedService>::CopyablePtr
          (CopyablePtr<perfetto::protos::gen::ChromeKeyedService> *this,
          CopyablePtr<perfetto::protos::gen::ChromeKeyedService> *other)

{
  ChromeKeyedService *this_00;
  CopyablePtr<perfetto::protos::gen::ChromeKeyedService> *other_local;
  CopyablePtr<perfetto::protos::gen::ChromeKeyedService> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::ChromeKeyedService,_std::default_delete<perfetto::protos::gen::ChromeKeyedService>_>
  ::unique_ptr(&this->ptr_,&other->ptr_);
  this_00 = (ChromeKeyedService *)operator_new(0x50);
  perfetto::protos::gen::ChromeKeyedService::ChromeKeyedService(this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::ChromeKeyedService,_std::default_delete<perfetto::protos::gen::ChromeKeyedService>_>
  ::reset(&other->ptr_,this_00);
  return;
}

Assistant:

CopyablePtr(CopyablePtr&& other) noexcept : ptr_(std::move(other.ptr_)) {
    other.ptr_.reset(new T());
  }